

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::subject::
SubjectFactoryTest_test_setting_ndf_with_Tenor_and_settlement_and_fixing_Test::TestBody
          (SubjectFactoryTest_test_setting_ndf_with_Tenor_and_settlement_and_fixing_Test *this)

{
  bool bVar1;
  string *psVar2;
  Tenor *pTVar3;
  Date *pDVar4;
  Date *pDVar5;
  undefined8 *puVar6;
  char *message;
  AssertionResult gtest_ar;
  SubjectFactory subject_factory;
  AssertHelper local_140 [2];
  undefined1 local_130 [16];
  internal local_120 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  long *local_110 [2];
  long local_100 [2];
  long *local_f0 [2];
  long local_e0 [2];
  long *local_d0 [2];
  long local_c0 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  undefined8 local_58;
  SubjectFactory local_50 [8];
  string local_48 [32];
  
  bidfx_public_api::price::subject::SubjectFactory::SubjectFactory(local_50,USER_INFO);
  bidfx_public_api::price::subject::SubjectFactory::Fx();
  local_58 = bidfx_public_api::price::subject::SubjectFactory::FX::Stream();
  bidfx_public_api::price::subject::SubjectFactory::FX::FXDealable::Ndf();
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"CSFX","");
  psVar2 = (string *)
           bidfx_public_api::price::subject::SubjectFactory::FX::Forward::LiquidityProvider
                     (local_48);
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"EURGBP","");
  psVar2 = (string *)
           bidfx_public_api::price::subject::SubjectFactory::FX::Forward::CurrencyPair(psVar2);
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"EUR","");
  bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Currency(psVar2);
  pTVar3 = (Tenor *)bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Quantity
                              (1000000.0);
  pDVar4 = (Date *)bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Tenor(pTVar3);
  pDVar5 = (Date *)operator_new(0xc);
  bidfx_public_api::tools::Date::Date(pDVar5,0x7e3,9,0x17);
  pDVar4 = (Date *)bidfx_public_api::price::subject::SubjectFactory::FX::Forward::SettlementDate
                             (pDVar4);
  pDVar5 = (Date *)operator_new(0xc);
  bidfx_public_api::tools::Date::Date(pDVar5,0x7e3,9,0x15);
  puVar6 = (undefined8 *)
           bidfx_public_api::price::subject::SubjectFactory::FX::Forward::FixingDate(pDVar4);
  (**(code **)*puVar6)(&local_b0,puVar6);
  bidfx_public_api::price::subject::Subject::ToString_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            (local_120,
             "\"AssetClass=Fx,BuySideAccount=FX_ACCT,Currency=EUR,DealType=NDF,FixingDate=20190921,Level=1,LiquidityProvider=CSFX,Quantity=1000000.00,RequestFor=Stream,SettlementDate=20190923,Symbol=EURGBP,Tenor=1Y,User=fbennett\""
             ,
             "subject_factory.Fx().Stream().Ndf() .LiquidityProvider(\"CSFX\") .CurrencyPair(\"EURGBP\") .Currency(\"EUR\") .Quantity(1000000) .Tenor(Tenor::IN_1_YEAR) .SettlementDate(new Date(2019, 9, 23)) .FixingDate(new Date(2019, 9, 21)) .CreateSubject() .ToString().c_str()"
             ,
             "AssetClass=Fx,BuySideAccount=FX_ACCT,Currency=EUR,DealType=NDF,FixingDate=20190921,Level=1,LiquidityProvider=CSFX,Quantity=1000000.00,RequestFor=Stream,SettlementDate=20190923,Symbol=EURGBP,Tenor=1Y,User=fbennett"
             ,(char *)local_140[0].data_);
  if (local_140[0].data_ != (AssertHelperData *)local_130) {
    operator_delete(local_140[0].data_,local_130._0_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0);
  if (local_110[0] != local_100) {
    operator_delete(local_110[0],local_100[0] + 1);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0],local_c0[0] + 1);
  }
  local_98.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)__cxa_throw;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90);
  if (local_120[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_118.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = ((local_118.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_140,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subject/subject_factory_test.cpp"
               ,0x2a1,message);
    testing::internal::AssertHelper::operator=(local_140,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_140);
    if (local_98.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_98.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_98.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_118,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(SubjectFactoryTest, test_setting_ndf_with_Tenor_and_settlement_and_fixing)
{
    SubjectFactory subject_factory = SubjectFactory(USER_INFO);

    ASSERT_STREQ(
            "AssetClass=Fx,BuySideAccount=FX_ACCT,Currency=EUR,DealType=NDF,FixingDate=20190921,Level=1,LiquidityProvider=CSFX,Quantity=1000000.00,RequestFor=Stream,SettlementDate=20190923,Symbol=EURGBP,Tenor=1Y,User=fbennett",
            subject_factory.Fx().Stream().Ndf()
                    .LiquidityProvider("CSFX")
                    .CurrencyPair("EURGBP")
                    .Currency("EUR")
                    .Quantity(1000000)
                    .Tenor(Tenor::IN_1_YEAR)
                    .SettlementDate(new Date(2019, 9, 23))
                    .FixingDate(new Date(2019, 9, 21))
                    .CreateSubject()
                    .ToString().c_str());
}